

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O2

void Server::process_request_line(single_connection *conn)

{
  char *__dest;
  int iVar1;
  char *__s;
  char *pcVar2;
  ulong uVar3;
  size_t __n;
  long lVar4;
  char *pcVar5;
  char local_168 [8];
  char temp_key [256];
  undefined1 local_60 [8];
  string temp_key_str;
  
  puts("------ REQUEST LINE PARSING START ------ ");
  conn->state = 4;
  pcVar5 = conn->querybuf;
  iVar1 = conn->query_start_index;
  pcVar2 = pcVar5 + iVar1;
  __s = strchr(pcVar2,0x20);
  if (__s == (char *)0x0) {
    pcVar2 = "[ERROR] Request method parsing failed ";
LAB_00105189:
    puts(pcVar2);
    return;
  }
  __dest = conn->method;
  __n = (size_t)((int)__s - (iVar1 + (int)pcVar5));
  strncpy(__dest,pcVar2,__n);
  printf("[Info] Request method: %s \n",__dest);
  lVar4 = (long)conn->query_start_index + __n + 1;
  conn->query_start_index = (int)lVar4;
  iVar1 = strcmp(__dest,"GET");
  if (iVar1 == 0) {
    local_60 = (undefined1  [8])&temp_key_str._M_string_length;
    temp_key_str._M_dataplus._M_p = (pointer)0x0;
    temp_key_str._M_string_length._0_1_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&query_list_abi_cxx11_);
    pcVar2 = conn->querybuf;
    iVar1 = conn->query_start_index;
    pcVar5 = strchr(pcVar2 + iVar1,0x20);
    if (pcVar5 == (char *)0x0) {
      puts("[ERROR] Request uri parsing failed");
    }
    else {
      temp_key_str.field_2._8_8_ = ZEXT48((uint)((int)pcVar5 - (iVar1 + (int)pcVar2)));
      while ((__s = strchr(__s + 1,0x3d), __s != (char *)0x0 &&
             (pcVar5 != __s && -1 < (long)pcVar5 - (long)__s))) {
        pcVar2 = strchr(__s,0x26);
        iVar1 = (int)pcVar2;
        if (pcVar2 == (char *)0x0) {
          iVar1 = (int)pcVar5;
        }
        memset(local_168,0,0x100);
        strncpy(local_168,__s + 1,(long)(int)(iVar1 + ~(uint)__s));
        std::__cxx11::string::assign((char *)local_60);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&query_list_abi_cxx11_,(value_type *)local_60);
      }
      printf("[INFO] Get %d key(s) from client \n",
             (long)query_list_abi_cxx11_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)query_list_abi_cxx11_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
      lVar4 = 0;
      uVar3 = 0;
      while (uVar3 < (ulong)((long)query_list_abi_cxx11_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)query_list_abi_cxx11_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        uVar3 = uVar3 + 1;
        printf("[INFO] The key %d is %s \n",uVar3 & 0xffffffff,
               *(undefined8 *)
                ((long)&((query_list_abi_cxx11_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
        lVar4 = lVar4 + 0x20;
      }
      conn->query_start_index = conn->query_start_index + (int)temp_key_str.field_2._8_8_ + 1;
    }
    std::__cxx11::string::~string((string *)local_60);
    if (pcVar5 == (char *)0x0) {
      return;
    }
  }
  else {
    pcVar5 = conn->querybuf + lVar4;
    pcVar2 = strchr(pcVar5,0x20);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "[ERROR] Request uri parsing failed ";
      goto LAB_00105189;
    }
    iVar1 = (int)pcVar2 - (int)pcVar5;
    strncpy(conn->uri,pcVar5,(long)iVar1);
    printf("[INFO] Request uri: %s \n",conn->uri);
    conn->query_start_index = conn->query_start_index + iVar1 + 1;
  }
  pcVar2 = conn->querybuf;
  pcVar5 = strchr(pcVar2,10);
  if (pcVar5 == (char *)0x0) {
    puts("[ERROR] Request version parsing failed ");
  }
  else {
    pcVar2 = pcVar2 + conn->query_start_index;
    iVar1 = (int)pcVar5 - (int)pcVar2;
    strncpy(conn->version,pcVar2,(long)(iVar1 + -1));
    printf("[INFO] Request version: %s \n",conn->version);
    conn->query_start_index = conn->query_start_index + iVar1 + 1;
    puts("------ REQUEST LINE PARSING END ------ ");
    process_head(conn);
  }
  return;
}

Assistant:

void Server::process_request_line(single_connection *conn)
{
    printf("------ REQUEST LINE PARSING START ------ \n");
    /* 连接状态为处理请求行 */
    conn->state = QUERY_LINE;

    /* 检验第一个空格的位置，用以定位请求方法 */
    char *ptr = strpbrk(conn->querybuf + conn->query_start_index, " ");
    if (!ptr)
    {
        printf("[ERROR] Request method parsing failed \n");
        return;
    }
    /* 请求方法长度 */
    int len = ptr - conn->querybuf - conn->query_start_index;
    /* 将请求方法复制到连接结构体中的method元素中 */
    strncpy(conn->method, conn->querybuf + conn->query_start_index, len);
    printf("[Info] Request method: %s \n", conn->method);
    /* 重新定位指针偏移量 */
    conn->query_start_index += (len + 1);

    /* 根据请求方法进行相应操作，当为GET时，将请求uri中的用户查询键分离出来后加入query_list中 */
    if (strcmp(conn->method, "GET") == 0)
    {
        /* key_len为各查询键的长度 */
        int key_len;
        /* 用户查询键临时变量 */
        char temp_key[256];
        /* 临时变量str类型 */
        string temp_key_str;
        /* 设置指针保存uri初始位置指针 */
        char *key_search_begin = NULL;
        /* findand为查询到的“&”的位置 */
        char *find_and = NULL;
        /* 清空query_list数组 */
        query_list.clear();
        /* 将uri初始位置指针赋值给key_search_begin */
        key_search_begin = ptr;
        /* 检验第二个空格的位置，用以定位请求uri */
        ptr = strpbrk(conn->querybuf + conn->query_start_index, " ");
        if (!ptr)
        {
            printf("[ERROR] Request uri parsing failed\n");
            return;
        }
        /* 目标资源uri长度 */
        len = ptr - conn->querybuf - conn->query_start_index;
        /* 将用户输入的查询串提取出键，放入query_list数组中 */
        while (true)
        {
            /* 定位“=”的位置 */
            key_search_begin = strpbrk(key_search_begin + 1, "=");
            /* 若该次查询到的等于号为空或其在ptr指针后，则退出循环 */
            if ((key_search_begin == NULL) || (ptr - key_search_begin <= 0))
            {
                /* 输出获得用户查询串中键的数量 */
                printf("[INFO] Get %d key(s) from client \n", query_list.size());
                break;
            }
            else
            {
                /* 定位“&”的位置 */
                find_and = strpbrk(key_search_begin, "&");
                /* 若该次查询到的“&”为空或其在ptr指针之后，则将其设为ptr */
                if ((find_and == NULL) || (ptr - find_and == 0))
                {
                    find_and = ptr;
                }
                /* 键长 */
                key_len = find_and - key_search_begin - 1;
                /* 拷贝键到temp_key */
                memset(temp_key, '\0', sizeof(temp_key));
                strncpy(temp_key, key_search_begin + 1, key_len);
                temp_key_str = temp_key;
                /* 向query_list添加键 */
                query_list.push_back(temp_key_str);
            }
        }
        /* 输出用户查询串中键的具体信息 */
        for (int i = 0; i < query_list.size(); i++)
        {
            printf("[INFO] The key %d is %s \n", i + 1, query_list[i].c_str());
        }
        conn->query_start_index += (len + 1);
    }
    /* 请求方法为非GET，此处为POST */
    else
    {
        ptr = strpbrk(conn->querybuf + conn->query_start_index, " ");
        if (!ptr)
        {
            printf("[ERROR] Request uri parsing failed \n");
            return;
        }
        /* 目标资源uri长度 */
        len = ptr - conn->querybuf - conn->query_start_index;
        strncpy(conn->uri, conn->querybuf + conn->query_start_index, len);

        printf("[INFO] Request uri: %s \n", conn->uri);

        conn->query_start_index += (len + 1);
    }

    /* 检验\n字符的位置，该行末尾为\r\n */
    ptr = strpbrk(conn->querybuf, "\n");
    if (!ptr)
    {
        printf("[ERROR] Request version parsing failed \n");
        return;
    }
    /* 客户端wget程序使用的HTTP版本号 */
    len = ptr - conn->querybuf - conn->query_start_index;
    /* 最后一个参数需要在原长度-1，即除去\r */
    strncpy(conn->version, conn->querybuf + conn->query_start_index, len - 1);

    printf("[INFO] Request version: %s \n", conn->version);

    conn->query_start_index += (len + 1);

    printf("------ REQUEST LINE PARSING END ------ \n");

    /* 解析请求头部 */
    process_head(conn);
}